

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O2

int * Gia_ManToResub(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  
  piVar4 = (int *)calloc((long)p->nObjs * 2,4);
  iVar1 = Gia_ManIsNormalized(p);
  if (iVar1 == 0) {
    __assert_fail("Gia_ManIsNormalized(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                  ,0x1f5,"int *Gia_ManToResub(Gia_Man_t *)");
  }
  lVar9 = 1;
  while( true ) {
    if (p->nObjs <= lVar9) {
      return piVar4;
    }
    iVar1 = (int)lVar9;
    pGVar5 = Gia_ManObj(p,iVar1);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar5 & 0x9fffffff) != 0) {
      pGVar6 = Gia_ManObj(p,iVar1);
      iVar2 = Abc_Var2Lit(iVar1 - (*(uint *)pGVar6 & 0x1fffffff),*(uint *)pGVar6 >> 0x1d & 1);
      piVar4[lVar9 * 2] = iVar2;
      iVar8 = (int)*(ulong *)pGVar5;
      uVar7 = *(ulong *)pGVar5 & 0x1fffffff;
      if (-1 < iVar8 || uVar7 == 0x1fffffff) {
        if ((iVar8 < 0) || ((int)uVar7 == 0x1fffffff)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                        ,0x1ff,"int *Gia_ManToResub(Gia_Man_t *)");
        }
        pGVar5 = Gia_ManObj(p,iVar1);
        uVar3 = (uint)((ulong)*(undefined8 *)pGVar5 >> 0x20);
        iVar2 = Abc_Var2Lit(iVar1 - (uVar3 & 0x1fffffff),uVar3 >> 0x1d & 1);
      }
      piVar4[lVar9 * 2 + 1] = iVar2;
    }
    lVar9 = lVar9 + 1;
  }
  return piVar4;
}

Assistant:

int * Gia_ManToResub( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, * pObjs = ABC_CALLOC( int, 2*Gia_ManObjNum(p) );
    assert( Gia_ManIsNormalized(p) );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            continue;
        pObjs[2*i+0] = Gia_ObjFaninLit0(Gia_ManObj(p, i), i);
        if ( Gia_ObjIsCo(pObj) )
            pObjs[2*i+1] = pObjs[2*i+0];
        else if ( Gia_ObjIsAnd(pObj) )
            pObjs[2*i+1] = Gia_ObjFaninLit1(Gia_ManObj(p, i), i);
        else assert( 0 );
    }
    return pObjs;
}